

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
pbrt::SceneRepresentation::ErrorExitDeferred<std::__cxx11::string&>
          (SceneRepresentation *this,FileLoc *loc,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 8) = 1;
  Error<std::__cxx11::string&>
            ((FileLoc *)this,(char *)loc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt);
  return;
}

Assistant:

void ErrorExitDeferred(const FileLoc *loc, const char *fmt, Args &&... args) const {
        errorExit = true;
        Error(loc, fmt, std::forward<Args>(args)...);
    }